

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:435:23)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:435:23)>
             *this)

{
  Mutex *local_18;
  
  anon_unknown_0::delay();
  MutexGuarded<unsigned_int>::lockExclusive
            ((MutexGuarded<unsigned_int> *)&stack0xffffffffffffffe8,(this->f).value);
  _::Mutex::induceSpuriousWakeupForTest(local_18);
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }